

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O1

void nni_msgq_aio_put(nni_msgq *mq,nni_aio *aio)

{
  nni_list *list;
  uint uVar1;
  _Bool _Var2;
  nni_aio *aio_00;
  nni_msg *m;
  size_t count;
  nni_aio *aio_01;
  uint uVar3;
  
  nni_mtx_lock(&mq->mq_lock);
  _Var2 = nni_aio_start(aio,nni_msgq_cancel,mq);
  if (_Var2) {
    list = &mq->mq_aio_putq;
    nni_aio_list_append(list,aio);
    aio_00 = (nni_aio *)nni_list_first(list);
    if (aio_00 != (nni_aio *)0x0) {
      do {
        m = nni_aio_get_msg(aio_00);
        count = nni_msg_len(m);
        aio_01 = (nni_aio *)nni_list_first(&mq->mq_aio_getq);
        if (aio_01 == (nni_aio *)0x0) {
          if (mq->mq_cap <= mq->mq_len) break;
          nni_list_remove(list,aio_00);
          uVar1 = mq->mq_put;
          uVar3 = uVar1 + 1;
          mq->mq_put = uVar3;
          mq->mq_msgs[uVar1] = m;
          if (uVar3 == mq->mq_alloc) {
            mq->mq_put = 0;
          }
          mq->mq_len = mq->mq_len + 1;
          nni_aio_set_msg(aio_00,(nni_msg *)0x0);
        }
        else {
          nni_aio_set_msg(aio_00,(nni_msg *)0x0);
          nni_aio_list_remove(aio_00);
          nni_aio_list_remove(aio_01);
          nni_aio_finish_msg(aio_01,m);
        }
        nni_aio_finish(aio_00,NNG_OK,count);
        aio_00 = (nni_aio *)nni_list_first(list);
      } while (aio_00 != (nni_aio *)0x0);
    }
    nni_msgq_run_notify(mq);
  }
  nni_mtx_unlock(&mq->mq_lock);
  return;
}

Assistant:

void
nni_msgq_aio_put(nni_msgq *mq, nni_aio *aio)
{
	nni_mtx_lock(&mq->mq_lock);

	// If this is an instantaneous poll operation, and the queue has
	// no room, nobody is waiting to receive, then report NNG_ETIMEDOUT.
	if (!nni_aio_start(aio, nni_msgq_cancel, mq)) {
		nni_mtx_unlock(&mq->mq_lock);
		return;
	}
	nni_aio_list_append(&mq->mq_aio_putq, aio);
	nni_msgq_run_putq(mq);
	nni_msgq_run_notify(mq);

	nni_mtx_unlock(&mq->mq_lock);
}